

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_idx_push(hts_idx_t *idx,int tid,int beg,int end,uint64_t offset,int is_mapped)

{
  int iVar1;
  uint32_t uVar2;
  bidx_t **ppbVar3;
  lidx_t *plVar4;
  kh_bin_t *pkVar5;
  int local_40;
  int32_t oldm;
  int bin;
  int is_mapped_local;
  uint64_t offset_local;
  int local_20;
  int end_local;
  int beg_local;
  int tid_local;
  hts_idx_t *idx_local;
  
  offset_local._4_4_ = end;
  local_20 = beg;
  if (tid < 0) {
    local_20 = -1;
    offset_local._4_4_ = 0;
  }
  if (idx->m <= tid) {
    iVar1 = idx->m;
    if (idx->m == 0) {
      local_40 = 2;
    }
    else {
      local_40 = idx->m << 1;
    }
    idx->m = local_40;
    ppbVar3 = (bidx_t **)realloc(idx->bidx,(long)idx->m << 3);
    idx->bidx = ppbVar3;
    plVar4 = (lidx_t *)realloc(idx->lidx,(long)idx->m << 4);
    idx->lidx = plVar4;
    memset(idx->bidx + iVar1,0,(long)(idx->m - iVar1) << 3);
    memset(idx->lidx + iVar1,0,(long)(idx->m - iVar1) << 4);
  }
  if (idx->n < tid + 1) {
    idx->n = tid + 1;
  }
  if ((idx->z).finished == 0) {
    if (((idx->z).last_tid == tid) && (((idx->z).last_tid < 0 || (-1 < tid)))) {
      if ((-1 < tid) && (local_20 < (idx->z).last_coor)) {
        if (0 < hts_verbose) {
          fprintf(_stderr,"[E::%s] unsorted positions\n","hts_idx_push");
        }
        return -1;
      }
    }
    else {
      if ((-1 < tid) && (idx->n_no_coor != 0)) {
        if (0 < hts_verbose) {
          fprintf(_stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n",
                  "hts_idx_push",(ulong)(uint)tid,(ulong)(uint)(idx->z).last_tid);
        }
        return -1;
      }
      if ((-1 < tid) && (idx->bidx[tid] != (bidx_t *)0x0)) {
        if (0 < hts_verbose) {
          fprintf(_stderr,"[E::%s] chromosome blocks not continuous\n","hts_idx_push");
        }
        return -1;
      }
      (idx->z).last_tid = tid;
      (idx->z).last_bin = 0xffffffff;
    }
    if (tid < 0) {
      idx->n_no_coor = idx->n_no_coor + 1;
    }
    else {
      if (idx->bidx[tid] == (bidx_t *)0x0) {
        pkVar5 = kh_init_bin();
        idx->bidx[tid] = pkVar5;
      }
      if (is_mapped != 0) {
        insert_to_l(idx->lidx + tid,(long)local_20,(long)offset_local._4_4_,(idx->z).last_off,
                    idx->min_shift);
      }
    }
    uVar2 = hts_reg2bin((long)local_20,(long)offset_local._4_4_,idx->min_shift,idx->n_lvls);
    if ((idx->z).last_bin != uVar2) {
      if ((idx->z).save_bin != 0xffffffff) {
        insert_to_b(idx->bidx[(idx->z).save_tid],(idx->z).save_bin,(idx->z).save_off,
                    (idx->z).last_off);
      }
      if (((idx->z).last_bin == 0xffffffff) && ((idx->z).save_bin != 0xffffffff)) {
        (idx->z).off_end = (idx->z).last_off;
        insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).off_beg,(idx->z).off_end);
        insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).n_mapped,
                    (idx->z).n_unmapped);
        (idx->z).n_unmapped = 0;
        (idx->z).n_mapped = 0;
        (idx->z).off_beg = (idx->z).off_end;
      }
      (idx->z).save_off = (idx->z).last_off;
      (idx->z).last_bin = uVar2;
      (idx->z).save_bin = uVar2;
      (idx->z).save_tid = tid;
    }
    if (is_mapped == 0) {
      (idx->z).n_unmapped = (idx->z).n_unmapped + 1;
    }
    else {
      (idx->z).n_mapped = (idx->z).n_mapped + 1;
    }
    (idx->z).last_off = offset;
    (idx->z).last_coor = local_20;
    return 0;
  }
  return 0;
}

Assistant:

int hts_idx_push(hts_idx_t *idx, int tid, int beg, int end, uint64_t offset, int is_mapped)
{
    int bin;
    if (tid<0) beg = -1, end = 0;
    if (tid >= idx->m) { // enlarge the index
        int32_t oldm = idx->m;
        idx->m = idx->m? idx->m<<1 : 2;
        idx->bidx = (bidx_t**)realloc(idx->bidx, idx->m * sizeof(bidx_t*));
        idx->lidx = (lidx_t*) realloc(idx->lidx, idx->m * sizeof(lidx_t));
        memset(&idx->bidx[oldm], 0, (idx->m - oldm) * sizeof(bidx_t*));
        memset(&idx->lidx[oldm], 0, (idx->m - oldm) * sizeof(lidx_t));
    }
    if (idx->n < tid + 1) idx->n = tid + 1;
    if (idx->z.finished) return 0;
    if (idx->z.last_tid != tid || (idx->z.last_tid >= 0 && tid < 0)) { // change of chromosome
        if ( tid>=0 && idx->n_no_coor )
        {
            if (hts_verbose >= 1) fprintf(stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n", __func__, tid,idx->z.last_tid);
            return -1;
        }
        if (tid>=0 && idx->bidx[tid] != 0)
        {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] chromosome blocks not continuous\n", __func__);
            return -1;
        }
        idx->z.last_tid = tid;
        idx->z.last_bin = 0xffffffffu;
    } else if (tid >= 0 && idx->z.last_coor > beg) { // test if positions are out of order
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] unsorted positions\n", __func__);
        return -1;
    }
    if ( tid>=0 )
    {
        if (idx->bidx[tid] == 0) idx->bidx[tid] = kh_init(bin);
        if ( is_mapped)
            insert_to_l(&idx->lidx[tid], beg, end, idx->z.last_off, idx->min_shift); // last_off points to the start of the current record
    }
    else idx->n_no_coor++;
    bin = hts_reg2bin(beg, end, idx->min_shift, idx->n_lvls);
    if ((int)idx->z.last_bin != bin) { // then possibly write the binning index
        if (idx->z.save_bin != 0xffffffffu) // save_bin==0xffffffffu only happens to the first record
            insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, idx->z.last_off);
        if (idx->z.last_bin == 0xffffffffu && idx->z.save_bin != 0xffffffffu) { // change of chr; keep meta information
            idx->z.off_end = idx->z.last_off;
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, idx->z.off_end);
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
            idx->z.n_mapped = idx->z.n_unmapped = 0;
            idx->z.off_beg = idx->z.off_end;
        }
        idx->z.save_off = idx->z.last_off;
        idx->z.save_bin = idx->z.last_bin = bin;
        idx->z.save_tid = tid;
    }
    if (is_mapped) ++idx->z.n_mapped;
    else ++idx->z.n_unmapped;
    idx->z.last_off = offset;
    idx->z.last_coor = beg;
    return 0;
}